

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O3

bool __thiscall wasm::ExecutionResults::areEqual(ExecutionResults *this,Literal *a,Literal *b)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  HeapType HVar4;
  ostream *poVar5;
  Literal in_stack_ffffffffffffff98;
  Literal local_48;
  char local_29;
  
  uVar1 = (a->type).id;
  if ((uVar1 & 1) == 0 && 6 < uVar1) {
    bVar2 = Type::isString(&a->type);
    if ((!bVar2) &&
       (HVar4 = Type::getHeapType(&a->type), ((uint)HVar4.id & 0x7b) != 0x30 || 0x7c < HVar4.id)) {
      return true;
    }
  }
  cVar3 = wasm::Literal::operator!=(a,b);
  if (cVar3 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"values not identical! ",0x16);
    wasm::Literal::Literal((Literal *)&stack0xffffffffffffffa0,a);
    poVar5 = (ostream *)wasm::operator<<((ostream *)&std::cout,in_stack_ffffffffffffff98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," != ",4);
    wasm::Literal::Literal(&local_48,b);
    poVar5 = (ostream *)wasm::operator<<(poVar5,in_stack_ffffffffffffff98);
    local_29 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_29,1);
    wasm::Literal::~Literal(&local_48);
    wasm::Literal::~Literal((Literal *)&stack0xffffffffffffffa0);
  }
  return cVar3 == '\0';
}

Assistant:

bool areEqual(Literal a, Literal b) {
    // Don't compare references. There are several issues here that we can't
    // fully handle, see https://github.com/WebAssembly/binaryen/issues/3378,
    // but the core issue is that since we optimize assuming a closed world, the
    // types and structure of GC data can arbitrarily change after
    // optimizations, even in ways that are externally visible from outside
    // the module.
    //
    // We can, however, compare strings as they refer to simple data that has a
    // consistent representation (the same reasons as why we can print them in
    // printValue(), above).
    //
    // TODO: Once we support optimizing under some form of open-world
    // assumption, we should be able to check that the types and/or structure of
    // GC data passed out of the module does not change.
    if (a.type.isRef() && !a.type.isString() &&
        !a.type.getHeapType().isMaybeShared(HeapType::i31)) {
      return true;
    }
    if (a != b) {
      std::cout << "values not identical! " << a << " != " << b << '\n';
      return false;
    }
    return true;
  }